

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetNumberOfMembers(MemoryObject *this)

{
  IRContext *this_00;
  uint32_t uVar1;
  int iVar2;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_indices;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this_00 = this->variable_inst_->context_;
  this_01 = IRContext::get_type_mgr(this_00);
  uVar1 = Instruction::type_id(this->variable_inst_);
  pTVar3 = analysis::TypeManager::GetType(this_01,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[0x20])(pTVar3);
  pTVar3 = *(Type **)(CONCAT44(extraout_var,iVar2) + 0x28);
  GetAccessIds((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,this);
  pTVar3 = analysis::TypeManager::GetMemberType
                     (this_01,pTVar3,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40);
  uVar1 = anon_unknown_0::GetNumberOfMembers(pTVar3,this_00);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return uVar1;
}

Assistant:

uint32_t CopyPropagateArrays::MemoryObject::GetNumberOfMembers() {
  IRContext* context = variable_inst_->context();
  analysis::TypeManager* type_mgr = context->get_type_mgr();

  const analysis::Type* type = type_mgr->GetType(variable_inst_->type_id());
  type = type->AsPointer()->pointee_type();

  std::vector<uint32_t> access_indices = GetAccessIds();
  type = type_mgr->GetMemberType(type, access_indices);

  return opt::GetNumberOfMembers(type, context);
}